

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktApiObjectManagementTests.cpp
# Opt level: O2

Parameters *
vkt::api::anon_unknown_1::PipelineLayout::Parameters::singleDescriptorSet
          (Parameters *__return_storage_ptr__,Parameters *descriptorSetLayout)

{
  pointer __result;
  pointer pPVar1;
  _Tp_alloc_type *in_RCX;
  size_t __n;
  
  (__return_storage_ptr__->pushConstantRanges).
  super__Vector_base<vk::VkPushConstantRange,_std::allocator<vk::VkPushConstantRange>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->pushConstantRanges).
  super__Vector_base<vk::VkPushConstantRange,_std::allocator<vk::VkPushConstantRange>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->descriptorSetLayouts).
  super__Vector_base<vkt::api::(anonymous_namespace)::DescriptorSetLayout::Parameters,_std::allocator<vkt::api::(anonymous_namespace)::DescriptorSetLayout::Parameters>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->pushConstantRanges).
  super__Vector_base<vk::VkPushConstantRange,_std::allocator<vk::VkPushConstantRange>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->descriptorSetLayouts).
  super__Vector_base<vkt::api::(anonymous_namespace)::DescriptorSetLayout::Parameters,_std::allocator<vkt::api::(anonymous_namespace)::DescriptorSetLayout::Parameters>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->descriptorSetLayouts).
  super__Vector_base<vkt::api::(anonymous_namespace)::DescriptorSetLayout::Parameters,_std::allocator<vkt::api::(anonymous_namespace)::DescriptorSetLayout::Parameters>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  __result = std::
             _Vector_base<vkt::api::(anonymous_namespace)::DescriptorSetLayout::Parameters,_std::allocator<vkt::api::(anonymous_namespace)::DescriptorSetLayout::Parameters>_>
             ::_M_allocate((_Vector_base<vkt::api::(anonymous_namespace)::DescriptorSetLayout::Parameters,_std::allocator<vkt::api::(anonymous_namespace)::DescriptorSetLayout::Parameters>_>
                            *)0x1,(size_t)descriptorSetLayout);
  std::
  vector<vkt::api::(anonymous_namespace)::DescriptorSetLayout::Parameters::Binding,_std::allocator<vkt::api::(anonymous_namespace)::DescriptorSetLayout::Parameters::Binding>_>
  ::vector(&__result->bindings,&descriptorSetLayout->bindings);
  pPVar1 = std::
           vector<vkt::api::(anonymous_namespace)::DescriptorSetLayout::Parameters,_std::allocator<vkt::api::(anonymous_namespace)::DescriptorSetLayout::Parameters>_>
           ::_S_relocate((pointer)0x0,(pointer)0x0,__result,in_RCX);
  pPVar1 = std::
           vector<vkt::api::(anonymous_namespace)::DescriptorSetLayout::Parameters,_std::allocator<vkt::api::(anonymous_namespace)::DescriptorSetLayout::Parameters>_>
           ::_S_relocate((pointer)0x0,(pointer)0x0,pPVar1 + 1,in_RCX);
  std::
  _Vector_base<vkt::api::(anonymous_namespace)::DescriptorSetLayout::Parameters,_std::allocator<vkt::api::(anonymous_namespace)::DescriptorSetLayout::Parameters>_>
  ::_M_deallocate((_Vector_base<vkt::api::(anonymous_namespace)::DescriptorSetLayout::Parameters,_std::allocator<vkt::api::(anonymous_namespace)::DescriptorSetLayout::Parameters>_>
                   *)0x0,(pointer)0x0,__n);
  (__return_storage_ptr__->descriptorSetLayouts).
  super__Vector_base<vkt::api::(anonymous_namespace)::DescriptorSetLayout::Parameters,_std::allocator<vkt::api::(anonymous_namespace)::DescriptorSetLayout::Parameters>_>
  ._M_impl.super__Vector_impl_data._M_start = __result;
  (__return_storage_ptr__->descriptorSetLayouts).
  super__Vector_base<vkt::api::(anonymous_namespace)::DescriptorSetLayout::Parameters,_std::allocator<vkt::api::(anonymous_namespace)::DescriptorSetLayout::Parameters>_>
  ._M_impl.super__Vector_impl_data._M_finish = pPVar1;
  (__return_storage_ptr__->descriptorSetLayouts).
  super__Vector_base<vkt::api::(anonymous_namespace)::DescriptorSetLayout::Parameters,_std::allocator<vkt::api::(anonymous_namespace)::DescriptorSetLayout::Parameters>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = __result + 1;
  return __return_storage_ptr__;
}

Assistant:

static Parameters singleDescriptorSet (const DescriptorSetLayout::Parameters& descriptorSetLayout)
		{
			Parameters params;
			params.descriptorSetLayouts.push_back(descriptorSetLayout);
			return params;
		}